

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_tex_parameterfv(NegativeTestContext *ctx)

{
  allocator<char> local_39;
  string local_38;
  GLfloat local_14;
  NegativeTestContext *pNStack_10;
  GLfloat params [1];
  NegativeTestContext *ctx_local;
  
  local_14 = 0.0;
  pNStack_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glGetTexParameterfv
            (&pNStack_10->super_CallLogWrapper,0xffffffff,0x2800,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  glu::CallLogWrapper::glGetTexParameterfv
            (&pNStack_10->super_CallLogWrapper,0xde1,0xffffffff,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  glu::CallLogWrapper::glGetTexParameterfv
            (&pNStack_10->super_CallLogWrapper,0xffffffff,0xffffffff,&local_14);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void get_tex_parameterfv (NegativeTestContext& ctx)
{
	GLfloat params[1] = { 0 };

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetTexParameterfv (-1, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterfv (GL_TEXTURE_2D, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterfv (-1, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}